

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::unordered_multiset<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>,void>
               (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  value_type_conflict5 *elem;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
  *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
  *container_local;
  
  std::operator<<(os,'{');
  __range3 = (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
              *)0x0;
  __end0 = std::
           unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
           ::begin(container);
  elem = (value_type_conflict5 *)
         std::
         unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
         end(container);
  do {
    bVar1 = std::__detail::operator==
                      (&__end0.super__Node_iterator_base<short,_false>,
                       (_Node_iterator_base<short,_false> *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002e0c67:
      if (__range3 !=
          (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
           *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = std::__detail::_Node_const_iterator<short,_true,_false>::operator*(&__end0);
    if ((__range3 !=
         (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
          *)0x0) &&
       (std::operator<<(os,','),
       __range3 ==
       (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *)
       0x20)) {
      std::operator<<(os," ...");
      goto LAB_002e0c67;
    }
    std::operator<<(os,' ');
    UniversalPrint<short>(value,os);
    __range3 = (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
                *)((long)&(__range3->_M_h)._M_buckets + 1);
    std::__detail::_Node_const_iterator<short,_true,_false>::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }